

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkP2PClientTest.cpp
# Opt level: O0

void __thiscall
MyP2PClientConnection::OnData
          (MyP2PClientConnection *this,uint32_t channel,uint8_t *data,uint32_t bytes)

{
  uint in_ECX;
  char *in_RDX;
  int in_ESI;
  long in_RDI;
  uint64_t owdUsec;
  uint64_t nowUsec;
  uint i_1;
  uint32_t packetIndex_1;
  uint32_t magic_1;
  uint64_t lo23;
  uint64_t lo16;
  uint32_t ts23;
  uint16_t ts16;
  uint i;
  uint32_t packetIndex;
  uint32_t magic;
  LogStringBuffer buffer_4;
  LogStringBuffer buffer;
  LogStringBuffer buffer_5;
  LogStringBuffer buffer_1;
  LogStringBuffer buffer_6;
  LogStringBuffer buffer_2;
  LogStringBuffer buffer_7;
  LogStringBuffer buffer_3;
  LogStringBuffer buffer_8;
  LogStringBuffer buffer_9;
  char *in_stack_ffffffffffffe308;
  LogStringBuffer *in_stack_ffffffffffffe310;
  uint64_t in_stack_ffffffffffffe318;
  OWDTimeStatistics *in_stack_ffffffffffffe320;
  LogStringBuffer *in_stack_ffffffffffffe348;
  OutputWorker *in_stack_ffffffffffffe350;
  Channel *pCVar1;
  LogStringBuffer *this_00;
  int local_1b20;
  int local_1b1c;
  long local_1b18;
  uint64_t local_1b10;
  uint local_1b04;
  uint local_1aec;
  uint32_t local_1ae8;
  uint32_t local_1ae4;
  uint64_t local_1ae0;
  uint64_t local_1ad8;
  uint32_t local_1ad0;
  uint16_t local_1aca;
  uint local_1ac8;
  uint32_t local_1ac4;
  uint32_t local_1ac0;
  uint local_1abc;
  char *local_1ab8;
  char *local_1aa0;
  Channel *local_1a98;
  char *local_1a90;
  Channel *local_1a88;
  char *local_1a80;
  Channel *local_1a78;
  char *local_1a70;
  Channel *local_1a68;
  char *local_1a60;
  Channel *local_1a58;
  char *local_1a50;
  Channel *local_1a48;
  char *local_1a40;
  Channel *local_1a38;
  OWDTimeStatistics *in_stack_ffffffffffffe5d0;
  undefined1 local_1968 [16];
  ostream aoStack_1958 [376];
  char *local_17e0;
  undefined4 local_17d4;
  Channel *local_17d0;
  undefined1 local_17b8 [16];
  ostream aoStack_17a8 [376];
  char *local_1630;
  undefined4 local_1624;
  Channel *local_1620;
  char *local_1618;
  undefined8 local_1610;
  undefined1 *local_1608;
  Channel *local_1600;
  char *local_15f8;
  undefined8 local_15f0;
  undefined1 *local_15e8;
  Channel *local_15e0;
  undefined8 local_15d8;
  undefined1 *local_15d0;
  Channel *local_15c8;
  undefined8 local_15c0;
  undefined1 *local_15b8;
  Channel *local_15b0;
  char *local_15a8;
  undefined1 *local_15a0;
  Channel *local_1598;
  char *local_1590;
  undefined1 *local_1588;
  Channel *local_1580;
  undefined8 local_1578;
  undefined1 *local_1570;
  undefined8 local_1568;
  undefined1 *local_1560;
  char *local_1558;
  undefined1 *local_1550;
  char *local_1548;
  undefined1 *local_1540;
  char *local_1538;
  undefined4 local_152c;
  Channel *local_1528;
  undefined4 local_151c;
  Channel *local_1518;
  char *local_1510;
  undefined4 local_1504;
  Channel *local_1500;
  undefined4 local_14f4;
  Channel *local_14f0;
  undefined1 local_14d8 [16];
  ostream aoStack_14c8 [376];
  char *local_1350;
  undefined4 local_1344;
  Channel *local_1340;
  undefined1 local_1328 [16];
  ostream aoStack_1318 [376];
  char *local_11a0;
  undefined4 local_1194;
  Channel *local_1190;
  char *local_1188;
  undefined8 local_1180;
  undefined1 *local_1178;
  Channel *local_1170;
  undefined8 local_1168;
  undefined1 *local_1160;
  Channel *local_1158;
  undefined8 local_1150;
  undefined1 *local_1148;
  char *local_1140;
  undefined8 local_1138;
  undefined1 *local_1130;
  Channel *local_1128;
  undefined8 local_1120;
  undefined1 *local_1118;
  Channel *local_1110;
  undefined8 local_1108;
  undefined1 *local_1100;
  char *local_10f8;
  undefined1 *local_10f0;
  Channel *local_10e8;
  char *local_10e0;
  undefined1 *local_10d8;
  Channel *local_10d0;
  char *local_10c8;
  undefined1 *local_10c0;
  char *local_10b8;
  undefined1 *local_10b0;
  char *local_10a8;
  undefined4 local_109c;
  Channel *local_1098;
  undefined4 local_108c;
  Channel *local_1088;
  char *local_1080;
  undefined4 local_1074;
  Channel *local_1070;
  undefined4 local_1064;
  Channel *local_1060;
  undefined1 local_1048 [16];
  ostream aoStack_1038 [376];
  char *local_ec0;
  undefined4 local_eb4;
  Channel *local_eb0;
  undefined1 local_e98 [16];
  ostream aoStack_e88 [376];
  char *local_d10;
  undefined4 local_d04;
  Channel *local_d00;
  char *local_cf8;
  undefined8 local_cf0;
  undefined1 *local_ce8;
  Channel *local_ce0;
  undefined8 local_cd8;
  undefined1 *local_cd0;
  Channel *local_cc8;
  undefined8 local_cc0;
  undefined1 *local_cb8;
  char *local_cb0;
  undefined8 local_ca8;
  undefined1 *local_ca0;
  Channel *local_c98;
  undefined8 local_c90;
  undefined1 *local_c88;
  Channel *local_c80;
  undefined8 local_c78;
  undefined1 *local_c70;
  char *local_c68;
  undefined1 *local_c60;
  Channel *local_c58;
  char *local_c50;
  undefined1 *local_c48;
  Channel *local_c40;
  char *local_c38;
  undefined1 *local_c30;
  char *local_c28;
  undefined1 *local_c20;
  char *local_c18;
  undefined4 local_c0c;
  Channel *local_c08;
  undefined4 local_bfc;
  Channel *local_bf8;
  char *local_bf0;
  undefined4 local_be4;
  Channel *local_be0;
  undefined4 local_bd4;
  Channel *local_bd0;
  undefined1 local_bb8 [16];
  ostream aoStack_ba8 [376];
  char *local_a30;
  undefined4 local_a24;
  Channel *local_a20;
  undefined1 local_a08 [16];
  ostream aoStack_9f8 [376];
  char *local_880;
  undefined4 local_874;
  Channel *local_870;
  char *local_868;
  undefined8 local_860;
  undefined1 *local_858;
  Channel *local_850;
  undefined8 local_848;
  undefined1 *local_840;
  Channel *local_838;
  undefined8 local_830;
  undefined1 *local_828;
  char *local_820;
  undefined8 local_818;
  undefined1 *local_810;
  Channel *local_808;
  undefined8 local_800;
  undefined1 *local_7f8;
  Channel *local_7f0;
  undefined8 local_7e8;
  undefined1 *local_7e0;
  char *local_7d8;
  undefined1 *local_7d0;
  Channel *local_7c8;
  char *local_7c0;
  undefined1 *local_7b8;
  Channel *local_7b0;
  char *local_7a8;
  undefined1 *local_7a0;
  char *local_798;
  undefined1 *local_790;
  uint *local_788;
  char *local_780;
  int *local_778;
  char *local_770;
  int *local_768;
  char *local_760;
  undefined4 local_754;
  Channel *local_750;
  undefined4 local_744;
  Channel *local_740;
  undefined1 local_728 [16];
  ostream aoStack_718 [376];
  uint *local_5a0;
  char *local_598;
  int *local_590;
  char *local_588;
  int *local_580;
  char *local_578;
  undefined4 local_56c;
  Channel *local_568;
  uint *local_560;
  char *local_558;
  int *local_550;
  char *local_548;
  int *local_540;
  char *local_538;
  undefined8 local_530;
  undefined1 *local_528;
  Channel *local_520;
  undefined8 local_518;
  undefined1 *local_510;
  Channel *local_508;
  undefined8 local_500;
  undefined1 *local_4f8;
  uint *local_4f0;
  char *local_4e8;
  int *local_4e0;
  char *local_4d8;
  int *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  Channel *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  Channel *local_4a0;
  uint *local_498;
  char *local_490;
  int *local_488;
  char *local_480;
  int *local_478;
  undefined1 *local_470;
  Channel *local_468;
  char *local_460;
  undefined1 *local_458;
  int *local_450;
  undefined1 *local_448;
  Channel *local_440;
  uint *local_438;
  char *local_430;
  int *local_428;
  char *local_420;
  undefined1 *local_418;
  Channel *local_410;
  int *local_408;
  undefined1 *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  Channel *local_3e8;
  uint *local_3e0;
  char *local_3d8;
  int *local_3d0;
  undefined1 *local_3c8;
  Channel *local_3c0;
  int *local_3b8;
  undefined1 *local_3b0;
  Channel *local_3a8;
  int *local_3a0;
  undefined1 *local_398;
  char *local_390;
  undefined1 *local_388;
  uint *local_380;
  char *local_378;
  undefined1 *local_370;
  LogStringBuffer *local_368;
  char *local_360;
  undefined1 *local_358;
  LogStringBuffer *local_350;
  uint *local_348;
  undefined1 *local_340;
  LogStringBuffer *local_338;
  char *local_330;
  undefined1 *local_328;
  uint *local_320;
  undefined1 *local_318;
  char *local_310;
  uint *local_308;
  char *local_300;
  undefined4 local_2f4;
  Channel *local_2f0;
  undefined4 local_2e4;
  Channel *local_2e0;
  undefined1 local_2c8 [16];
  ostream aoStack_2b8 [376];
  char *local_140;
  uint *local_138;
  char *local_130;
  undefined4 local_124;
  Channel *local_120;
  char *local_118;
  uint *local_110;
  char *local_108;
  string *local_100;
  undefined1 *local_f8;
  Channel *local_f0;
  string *local_e8;
  undefined1 *local_e0;
  Channel *local_d8;
  string *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  uint *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  Channel *local_a0;
  char *local_98;
  undefined1 *local_90;
  Channel *local_88;
  char *local_80;
  uint *local_78;
  undefined1 *local_70;
  Channel *local_68;
  uint *local_60;
  undefined1 *local_58;
  Channel *local_50;
  uint *local_48;
  undefined1 *local_40;
  char *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  Channel *local_18;
  char *local_10;
  undefined1 *local_8;
  
  if (in_ECX == 0) {
    return;
  }
  if (in_ECX != 0) {
    local_1abc = in_ECX;
    local_1ab8 = in_RDX;
    if (*in_RDX == '\a') {
      if (in_ESI != 0x98) {
        local_1a88 = &Logger;
        local_1a90 = "Corrupted data: Wrong channel";
        if ((int)Logger.ChannelMinLevel < 5) {
          local_1620 = &Logger;
          local_1624 = 4;
          local_1630 = "Corrupted data: Wrong channel";
          logger::LogStringBuffer::LogStringBuffer
                    (in_stack_ffffffffffffe310,in_stack_ffffffffffffe308,Trace);
          local_1610 = 0x12d358;
          local_1600 = &Logger;
          local_1618 = local_1630;
          local_15b0 = &Logger;
          local_1608 = local_17b8;
          local_15c0 = local_1610;
          local_15b8 = local_17b8;
          local_1578 = local_1610;
          local_1570 = local_17b8;
          std::operator<<(aoStack_17a8,(string *)&Logger.Prefix);
          local_1580 = &Logger;
          local_1588 = local_1608;
          local_1590 = local_1618;
          local_1550 = local_1608;
          local_1558 = local_1618;
          std::operator<<((ostream *)(local_1608 + 0x10),local_1618);
          logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(in_stack_ffffffffffffe350,in_stack_ffffffffffffe348);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1084ef);
        }
      }
      if (local_1abc != 0x578) {
        local_1a68 = &Logger;
        local_1a70 = "Corrupted data: Wrong size";
        local_1528 = &Logger;
        local_152c = 4;
        local_1538 = "Corrupted data: Wrong size";
        local_1518 = &Logger;
        local_151c = 4;
        if ((int)Logger.ChannelMinLevel < 5) {
          local_1190 = &Logger;
          local_1194 = 4;
          local_11a0 = "Corrupted data: Wrong size";
          logger::LogStringBuffer::LogStringBuffer
                    (in_stack_ffffffffffffe310,in_stack_ffffffffffffe308,Trace);
          local_1180 = 0x12d358;
          local_1170 = &Logger;
          local_1188 = local_11a0;
          local_1158 = &Logger;
          local_1178 = local_1328;
          local_1168 = local_1180;
          local_1160 = local_1328;
          local_1150 = local_1180;
          local_1148 = local_1328;
          std::operator<<(aoStack_1318,(string *)&Logger.Prefix);
          local_10d0 = &Logger;
          local_10d8 = local_1178;
          local_10e0 = local_1188;
          local_10c0 = local_1178;
          local_10c8 = local_1188;
          std::operator<<((ostream *)(local_1178 + 0x10),local_1188);
          logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(in_stack_ffffffffffffe350,in_stack_ffffffffffffe348);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x108776);
        }
      }
      local_1ac0 = tonk::ReadU24_LE((uint8_t *)(local_1ab8 + 6));
      if (local_1ac0 != 0xadd12d) {
        local_1a48 = &Logger;
        local_1a50 = "Corrupted data: Bad magic";
        local_1098 = &Logger;
        local_109c = 4;
        local_10a8 = "Corrupted data: Bad magic";
        local_1088 = &Logger;
        local_108c = 4;
        if ((int)Logger.ChannelMinLevel < 5) {
          local_d00 = &Logger;
          local_d04 = 4;
          local_d10 = "Corrupted data: Bad magic";
          logger::LogStringBuffer::LogStringBuffer
                    (in_stack_ffffffffffffe310,in_stack_ffffffffffffe308,Trace);
          local_cf0 = 0x12d358;
          local_ce0 = &Logger;
          local_cf8 = local_d10;
          local_cc8 = &Logger;
          local_ce8 = local_e98;
          local_cd8 = local_cf0;
          local_cd0 = local_e98;
          local_cc0 = local_cf0;
          local_cb8 = local_e98;
          std::operator<<(aoStack_e88,(string *)&Logger.Prefix);
          local_c40 = &Logger;
          local_c48 = local_ce8;
          local_c50 = local_cf8;
          local_c30 = local_ce8;
          local_c38 = local_cf8;
          std::operator<<((ostream *)(local_ce8 + 0x10),local_cf8);
          logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(in_stack_ffffffffffffe350,in_stack_ffffffffffffe348);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x108a19);
        }
      }
      local_1ac4 = tonk::ReadU32_LE((uint8_t *)(local_1ab8 + 9));
      if (*(uint32_t *)(in_RDI + 0x1f94) != local_1ac4) {
        local_c08 = &Logger;
        local_c0c = 4;
        local_c18 = "Corrupted data: Incorrect packet id";
        local_bf8 = &Logger;
        local_bfc = 4;
        if ((int)Logger.ChannelMinLevel < 5) {
          local_870 = &Logger;
          local_874 = 4;
          local_880 = "Corrupted data: Incorrect packet id";
          logger::LogStringBuffer::LogStringBuffer
                    (in_stack_ffffffffffffe310,in_stack_ffffffffffffe308,Trace);
          local_860 = 0x12d358;
          local_850 = &Logger;
          local_868 = local_880;
          local_838 = &Logger;
          local_858 = local_a08;
          local_848 = local_860;
          local_840 = local_a08;
          local_830 = local_860;
          local_828 = local_a08;
          std::operator<<(aoStack_9f8,(string *)&Logger.Prefix);
          local_7b0 = &Logger;
          local_7b8 = local_858;
          local_7c0 = local_868;
          local_7a0 = local_858;
          local_7a8 = local_868;
          std::operator<<((ostream *)(local_858 + 0x10),local_868);
          logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(in_stack_ffffffffffffe350,in_stack_ffffffffffffe348);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x108cd0);
        }
      }
      *(uint32_t *)(in_RDI + 0x1f94) = local_1ac4 + 1;
      for (local_1ac8 = 0xd; local_1ac8 < local_1abc; local_1ac8 = local_1ac8 + 1) {
      }
      return;
    }
    if (*in_RDX == '\b') {
      if (in_ESI != 0x98) {
        local_1a98 = &Logger;
        local_1aa0 = "Corrupted data: Wrong channel";
        if ((int)Logger.ChannelMinLevel < 5) {
          local_17d0 = &Logger;
          local_17d4 = 4;
          local_17e0 = "Corrupted data: Wrong channel";
          logger::LogStringBuffer::LogStringBuffer
                    (in_stack_ffffffffffffe310,in_stack_ffffffffffffe308,Trace);
          local_15f0 = 0x12d358;
          local_15e0 = &Logger;
          local_15f8 = local_17e0;
          local_15c8 = &Logger;
          local_15e8 = local_1968;
          local_15d8 = local_15f0;
          local_15d0 = local_1968;
          local_1568 = local_15f0;
          local_1560 = local_1968;
          std::operator<<(aoStack_1958,(string *)&Logger.Prefix);
          local_1598 = &Logger;
          local_15a0 = local_15e8;
          local_15a8 = local_15f8;
          local_1540 = local_15e8;
          local_1548 = local_15f8;
          std::operator<<((ostream *)(local_15e8 + 0x10),local_15f8);
          logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(in_stack_ffffffffffffe350,in_stack_ffffffffffffe348);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x108fc0);
        }
      }
      if (local_1abc != 0x578) {
        local_1a78 = &Logger;
        local_1a80 = "Corrupted data: Wrong size";
        local_1500 = &Logger;
        local_1504 = 4;
        local_1510 = "Corrupted data: Wrong size";
        local_14f0 = &Logger;
        local_14f4 = 4;
        if ((int)Logger.ChannelMinLevel < 5) {
          local_1340 = &Logger;
          local_1344 = 4;
          local_1350 = "Corrupted data: Wrong size";
          logger::LogStringBuffer::LogStringBuffer
                    (in_stack_ffffffffffffe310,in_stack_ffffffffffffe308,Trace);
          local_1138 = 0x12d358;
          local_1128 = &Logger;
          local_1140 = local_1350;
          local_1110 = &Logger;
          local_1130 = local_14d8;
          local_1120 = local_1138;
          local_1118 = local_14d8;
          local_1108 = local_1138;
          local_1100 = local_14d8;
          std::operator<<(aoStack_14c8,(string *)&Logger.Prefix);
          local_10e8 = &Logger;
          local_10f0 = local_1130;
          local_10f8 = local_1140;
          local_10b0 = local_1130;
          local_10b8 = local_1140;
          std::operator<<((ostream *)(local_1130 + 0x10),local_1140);
          logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(in_stack_ffffffffffffe350,in_stack_ffffffffffffe348);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x109247);
        }
      }
      local_1aca = tonk::ReadU16_LE((uint8_t *)(local_1ab8 + 1));
      local_1ad0 = tonk::ReadU24_LE((uint8_t *)(local_1ab8 + 3));
      local_1ad8 = tonk::SDKConnection::FromLocalTime16
                             ((SDKConnection *)in_stack_ffffffffffffe310,
                              (uint16_t)((ulong)in_stack_ffffffffffffe308 >> 0x30));
      local_1ae0 = tonk::SDKConnection::FromLocalTime23
                             ((SDKConnection *)in_stack_ffffffffffffe310,
                              (uint32_t)((ulong)in_stack_ffffffffffffe308 >> 0x20));
      local_1ae4 = tonk::ReadU24_LE((uint8_t *)(local_1ab8 + 6));
      if (local_1ae4 != 0xadd12d) {
        local_1a58 = &Logger;
        local_1a60 = "Corrupted data: Bad magic";
        local_1070 = &Logger;
        local_1074 = 4;
        local_1080 = "Corrupted data: Bad magic";
        local_1060 = &Logger;
        local_1064 = 4;
        if ((int)Logger.ChannelMinLevel < 5) {
          local_eb0 = &Logger;
          local_eb4 = 4;
          local_ec0 = "Corrupted data: Bad magic";
          logger::LogStringBuffer::LogStringBuffer
                    (in_stack_ffffffffffffe310,in_stack_ffffffffffffe308,Trace);
          local_ca8 = 0x12d358;
          local_c98 = &Logger;
          local_cb0 = local_ec0;
          local_c80 = &Logger;
          local_ca0 = local_1048;
          local_c90 = local_ca8;
          local_c88 = local_1048;
          local_c78 = local_ca8;
          local_c70 = local_1048;
          std::operator<<(aoStack_1038,(string *)&Logger.Prefix);
          local_c58 = &Logger;
          local_c60 = local_ca0;
          local_c68 = local_cb0;
          local_c20 = local_ca0;
          local_c28 = local_cb0;
          std::operator<<((ostream *)(local_ca0 + 0x10),local_cb0);
          logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(in_stack_ffffffffffffe350,in_stack_ffffffffffffe348);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x109558);
        }
      }
      local_1ae8 = tonk::ReadU32_LE((uint8_t *)(local_1ab8 + 9));
      if (*(uint32_t *)(in_RDI + 0x1f94) != local_1ae8) {
        local_1a38 = &Logger;
        local_1a40 = "Corrupted data: Incorrect packet id";
        local_be0 = &Logger;
        local_be4 = 4;
        local_bf0 = "Corrupted data: Incorrect packet id";
        local_bd0 = &Logger;
        local_bd4 = 4;
        if ((int)Logger.ChannelMinLevel < 5) {
          local_a20 = &Logger;
          local_a24 = 4;
          local_a30 = "Corrupted data: Incorrect packet id";
          logger::LogStringBuffer::LogStringBuffer
                    (in_stack_ffffffffffffe310,in_stack_ffffffffffffe308,Trace);
          local_818 = 0x12d358;
          local_808 = &Logger;
          local_820 = local_a30;
          local_7f0 = &Logger;
          local_810 = local_bb8;
          local_800 = local_818;
          local_7f8 = local_bb8;
          local_7e8 = local_818;
          local_7e0 = local_bb8;
          std::operator<<(aoStack_ba8,(string *)&Logger.Prefix);
          local_7c8 = &Logger;
          local_7d0 = local_810;
          local_7d8 = local_820;
          local_790 = local_810;
          local_798 = local_820;
          std::operator<<((ostream *)(local_810 + 0x10),local_820);
          logger::OutputWorker::GetInstance();
          logger::OutputWorker::Write(in_stack_ffffffffffffe350,in_stack_ffffffffffffe348);
          logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10980f);
        }
      }
      *(uint32_t *)(in_RDI + 0x1f94) = local_1ae8 + 1;
      for (local_1aec = 0xd; local_1aec < local_1abc; local_1aec = local_1aec + 1) {
      }
      tonk::SDKConnection::GetStatus((SDKConnection *)in_stack_ffffffffffffe310);
      if ((local_1b04 & 1) == 0) {
        return;
      }
      local_1b10 = tonk_time();
      local_1b18 = local_1b10 - local_1ae0;
      test::OWDTimeStatistics::AddSample(in_stack_ffffffffffffe320,in_stack_ffffffffffffe318);
      if (local_1b10 - *(long *)(in_RDI + 0x1f88) < 2000000) {
        return;
      }
      *(uint64_t *)(in_RDI + 0x1f88) = local_1b10;
      local_1b1c = (int)local_1b10 - (int)local_1ad8;
      local_1b20 = (int)local_1b10 - (int)local_1ae0;
      local_768 = &local_1b1c;
      local_778 = &local_1b20;
      local_788 = &local_1ae8;
      local_750 = &Logger;
      local_754 = 2;
      local_760 = "DATA RESULT: Transmission time (acc=16) = ";
      local_770 = ", (acc=23) = ";
      local_780 = " # ";
      local_740 = &Logger;
      local_744 = 2;
      if ((int)Logger.ChannelMinLevel < 3) {
        local_568 = &Logger;
        local_56c = 2;
        local_578 = "DATA RESULT: Transmission time (acc=16) = ";
        local_588 = ", (acc=23) = ";
        local_598 = " # ";
        local_5a0 = local_788;
        local_590 = local_778;
        local_580 = local_768;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_ffffffffffffe310,in_stack_ffffffffffffe308,Trace);
        local_530 = 0x12d358;
        local_520 = &Logger;
        local_538 = local_578;
        local_540 = local_580;
        local_548 = local_588;
        local_550 = local_590;
        local_558 = local_598;
        local_560 = local_5a0;
        local_508 = &Logger;
        local_528 = local_728;
        local_518 = local_530;
        local_510 = local_728;
        local_500 = local_530;
        local_4f8 = local_728;
        std::operator<<(aoStack_718,(string *)&Logger.Prefix);
        local_4b8 = &Logger;
        local_4c0 = local_528;
        local_4c8 = local_538;
        local_4d0 = local_540;
        local_4d8 = local_548;
        local_4e0 = local_550;
        local_4e8 = local_558;
        local_4f0 = local_560;
        local_4a0 = &Logger;
        local_4a8 = local_528;
        local_4b0 = local_538;
        local_458 = local_528;
        local_460 = local_538;
        std::operator<<((ostream *)(local_528 + 0x10),local_538);
        local_468 = &Logger;
        local_470 = local_4c0;
        local_478 = local_4d0;
        local_480 = local_4d8;
        local_488 = local_4e0;
        local_490 = local_4e8;
        local_498 = local_4f0;
        local_440 = &Logger;
        local_448 = local_4c0;
        local_450 = local_4d0;
        local_400 = local_4c0;
        local_408 = local_4d0;
        std::ostream::operator<<((ostream *)(local_4c0 + 0x10),*local_4d0);
        local_410 = &Logger;
        local_418 = local_470;
        local_420 = local_480;
        local_428 = local_488;
        local_430 = local_490;
        local_438 = local_498;
        local_3e8 = &Logger;
        local_3f0 = local_470;
        local_3f8 = local_480;
        local_388 = local_470;
        local_390 = local_480;
        std::operator<<((ostream *)(local_470 + 0x10),local_480);
        local_3c0 = &Logger;
        local_3c8 = local_418;
        local_3d0 = local_428;
        local_3d8 = local_430;
        local_3e0 = local_438;
        pCVar1 = &Logger;
        local_3a8 = &Logger;
        local_3b0 = local_418;
        local_3b8 = local_428;
        local_398 = local_418;
        local_3a0 = local_428;
        std::ostream::operator<<((ostream *)(local_418 + 0x10),*local_428);
        local_370 = local_3c8;
        local_378 = local_3d8;
        local_380 = local_3e0;
        local_358 = local_3c8;
        local_360 = local_3d8;
        local_328 = local_3c8;
        local_330 = local_3d8;
        this_00 = (LogStringBuffer *)pCVar1;
        local_368 = (LogStringBuffer *)pCVar1;
        local_350 = (LogStringBuffer *)pCVar1;
        std::operator<<((ostream *)(local_3c8 + 0x10),local_3d8);
        local_340 = local_370;
        local_348 = local_380;
        local_318 = local_370;
        local_320 = local_380;
        local_338 = (LogStringBuffer *)pCVar1;
        std::ostream::operator<<((ostream *)(local_370 + 0x10),*local_380);
        logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write((OutputWorker *)this_00,(LogStringBuffer *)pCVar1);
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10a0e5);
      }
      test::OWDTimeStatistics::PrintStatistics(in_stack_ffffffffffffe5d0);
      return;
    }
  }
  local_308 = &local_1abc;
  local_2f0 = &Logger;
  local_2f4 = 4;
  local_300 = "Peer: Got ";
  local_310 = " bytes of message data";
  local_2e0 = &Logger;
  local_2e4 = 4;
  if ((int)Logger.ChannelMinLevel < 5) {
    local_120 = &Logger;
    local_124 = 4;
    local_130 = "Peer: Got ";
    local_140 = " bytes of message data";
    pCVar1 = &Logger;
    local_138 = local_308;
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_ffffffffffffe310,in_stack_ffffffffffffe308,Trace);
    local_100 = &pCVar1->Prefix;
    local_108 = local_130;
    local_110 = local_138;
    local_118 = local_140;
    local_f8 = local_2c8;
    local_f0 = pCVar1;
    local_e8 = local_100;
    local_e0 = local_2c8;
    local_d8 = pCVar1;
    local_d0 = local_100;
    local_c8 = local_2c8;
    std::operator<<(aoStack_2b8,(string *)local_100);
    local_a8 = local_f8;
    local_b0 = local_108;
    local_b8 = local_110;
    local_c0 = local_118;
    local_90 = local_f8;
    local_98 = local_108;
    local_30 = local_f8;
    local_38 = local_108;
    local_a0 = pCVar1;
    local_88 = pCVar1;
    std::operator<<((ostream *)(local_f8 + 0x10),local_108);
    local_70 = local_a8;
    local_78 = local_b8;
    local_80 = local_c0;
    local_58 = local_a8;
    local_60 = local_b8;
    local_40 = local_a8;
    local_48 = local_b8;
    local_68 = pCVar1;
    local_50 = pCVar1;
    std::ostream::operator<<((ostream *)(local_a8 + 0x10),*local_b8);
    local_20 = local_70;
    local_28 = local_80;
    local_8 = local_70;
    local_10 = local_80;
    local_18 = pCVar1;
    std::operator<<((ostream *)(local_70 + 0x10),local_80);
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(in_stack_ffffffffffffe350,in_stack_ffffffffffffe348);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10a53f);
  }
  return;
}

Assistant:

void MyP2PClientConnection::OnData(
    uint32_t          channel,  // Channel number attached to each message by sender
    const uint8_t*       data,  // Pointer to a buffer containing the message data
    uint32_t            bytes   // Number of bytes in the message
)
{
    if (bytes <= 0)
        return;

    if (bytes > 0)
    {
        if (data[0] == ID_LowPriBulkData_NoTimestamp)
        {
            TONK_CPP_SDK_DEBUG_ASSERT(channel == kLowPriBulkData_Channel);
            if (channel != kLowPriBulkData_Channel) {
                Logger.Error("Corrupted data: Wrong channel");
            }
            TONK_CPP_SDK_DEBUG_ASSERT(bytes == kLowPriBulkData_Bytes);
            if (bytes != kLowPriBulkData_Bytes) {
                Logger.Error("Corrupted data: Wrong size");
            }
            uint32_t magic = tonk::ReadU24_LE(data + 1 + 2 + 3);
            if (magic != kLowPriBulkMagic) {
                Logger.Error("Corrupted data: Bad magic");
            }
            TONK_CPP_SDK_DEBUG_ASSERT(magic == kLowPriBulkMagic);
            uint32_t packetIndex = tonk::ReadU32_LE(data + 1 + 2 + 3 + 3);
            TONK_CPP_SDK_DEBUG_ASSERT(NextPacketIndex == packetIndex);
            if (NextPacketIndex != packetIndex) {
                Logger.Error("Corrupted data: Incorrect packet id");
            }
            NextPacketIndex = packetIndex + 1;
            for (unsigned i = 1 + 2 + 3 + 3 + 4; i < bytes; ++i) {
                TONK_CPP_SDK_DEBUG_ASSERT(data[i] == (uint8_t)i);
            }

            return;
        }

        if (data[0] == ID_LowPriBulkData_HasTimestamp)
        {
            TONK_CPP_SDK_DEBUG_ASSERT(channel == kLowPriBulkData_Channel);
            if (channel != kLowPriBulkData_Channel) {
                Logger.Error("Corrupted data: Wrong channel");
            }
            TONK_CPP_SDK_DEBUG_ASSERT(bytes == kLowPriBulkData_Bytes);
            if (bytes != kLowPriBulkData_Bytes) {
                Logger.Error("Corrupted data: Wrong size");
            }
            uint16_t ts16 = tonk::ReadU16_LE(data + 1);
            uint32_t ts23 = tonk::ReadU24_LE(data + 1 + 2);
            uint64_t lo16 = FromLocalTime16(ts16);
            uint64_t lo23 = FromLocalTime23(ts23);
            uint32_t magic = tonk::ReadU24_LE(data + 1 + 2 + 3);
            if (magic != kLowPriBulkMagic) {
                Logger.Error("Corrupted data: Bad magic");
            }
            TONK_CPP_SDK_DEBUG_ASSERT(magic == kLowPriBulkMagic);
            uint32_t packetIndex = tonk::ReadU32_LE(data + 1 + 2 + 3 + 3);
            TONK_CPP_SDK_DEBUG_ASSERT(NextPacketIndex == packetIndex);
            if (NextPacketIndex != packetIndex) {
                Logger.Error("Corrupted data: Incorrect packet id");
            }
            NextPacketIndex = packetIndex + 1;
            for (unsigned i = 1 + 2 + 3 + 3 + 4; i < bytes; ++i) {
                TONK_CPP_SDK_DEBUG_ASSERT(data[i] == (uint8_t)i);
            }

            if (0 != (GetStatus().Flags & TonkFlag_TimeSync))
            {
                uint64_t nowUsec = tonk_time();
                uint64_t owdUsec = nowUsec - lo23;
                OWDStats.AddSample(owdUsec);

                if (nowUsec - LastStatsUsec >= kStatsReportIntervalUsec)
                {
                    LastStatsUsec = nowUsec;
#ifdef ENABLE_P2P_DATA_RESULT
                    Logger.Info("DATA RESULT: Transmission time (acc=16) = ", (int)(nowUsec - lo16), ", (acc=23) = ", (int)(nowUsec - lo23), " # ", packetIndex);
                    OWDStats.PrintStatistics();
#endif
                }
            }

            return;
        }
    }

    Logger.Error("Peer: Got ", bytes, " bytes of message data");
    TONK_CPP_SDK_DEBUG_BREAK();
}